

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
draco::PlyReader::SplitWords
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PlyReader *this,string *line)

{
  bool bVar1;
  long lVar2;
  string last_word;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    lVar2 = std::__cxx11::string::find_first_of((char *)line,0x15225a);
    if (lVar2 == -1) break;
    std::__cxx11::string::substr((ulong)&last_word,(ulong)line);
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )last_word._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(last_word._M_dataplus._M_p + last_word._M_string_length),isspace);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&last_word);
    }
    std::__cxx11::string::~string((string *)&last_word);
  }
  std::__cxx11::string::substr((ulong)&last_word,(ulong)line);
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )last_word._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(last_word._M_dataplus._M_p + last_word._M_string_length),isspace);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&last_word);
  }
  std::__cxx11::string::~string((string *)&last_word);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PlyReader::SplitWords(const std::string &line) {
  std::vector<std::string> output;
  std::string::size_type start = 0;
  std::string::size_type end = 0;

  // Check for isspace chars.
  while ((end = line.find_first_of(" \t\n\v\f\r", start)) !=
         std::string::npos) {
    const std::string word(line.substr(start, end - start));
    if (!std::all_of(word.begin(), word.end(), isspace)) {
      output.push_back(word);
    }
    start = end + 1;
  }

  const std::string last_word(line.substr(start));
  if (!std::all_of(last_word.begin(), last_word.end(), isspace)) {
    output.push_back(last_word);
  }
  return output;
}